

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedEnumFieldGenerator::GenerateSerializedSizeCode
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldOptions *pFVar2;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"{\n  int dataSize = 0;\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&this->variables_,
                     "for (int i = 0; i < $name$_.size(); i++) {\n  dataSize += com.google.protobuf.CodedOutputStream\n    .computeEnumSizeNoTag($name$_.get(i).getNumber());\n}\n"
                    );
  io::Printer::Print(printer,"size += dataSize;\n");
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar2);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (!get$capitalized_name$List().isEmpty()) {  size += $tag_size$;\n  size += com.google.protobuf.CodedOutputStream\n    .computeRawVarint32Size(dataSize);\n}"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,"size += $tag_size$ * $name$_.size();\n");
  }
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar2);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"$name$MemoizedSerializedSize = dataSize;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  int dataSize = 0;\n");
  printer->Indent();

  printer->Print(variables_,
    "for (int i = 0; i < $name$_.size(); i++) {\n"
    "  dataSize += com.google.protobuf.CodedOutputStream\n"
    "    .computeEnumSizeNoTag($name$_.get(i).getNumber());\n"
    "}\n");
  printer->Print(
    "size += dataSize;\n");
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (!get$capitalized_name$List().isEmpty()) {"
      "  size += $tag_size$;\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "    .computeRawVarint32Size(dataSize);\n"
      "}");
  } else {
    printer->Print(variables_,
      "size += $tag_size$ * $name$_.size();\n");
  }

  // cache the data size for packed fields.
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "$name$MemoizedSerializedSize = dataSize;\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}